

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  pointer pMVar7;
  void *pvVar8;
  void *pvVar9;
  unsigned_long uVar10;
  Mat *this_00;
  pointer pvVar11;
  float *pfVar12;
  size_type __n;
  pointer pfVar13;
  int *piVar14;
  ulong uVar15;
  size_type sVar16;
  int iVar17;
  size_type sVar18;
  size_type __new_size;
  long lVar19;
  ulong uVar20;
  long lVar21;
  float *pfVar22;
  ulong uVar23;
  size_type sVar24;
  ulong uVar25;
  size_t j;
  uint _h;
  long lVar26;
  int i;
  long lVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  long local_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  void *local_160;
  ulong local_150;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  Mat local_98;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = this->num_class;
  if (iVar6 == -0xe9) {
    uVar15 = (ulong)(uint)pMVar7[2].h;
    local_190 = (long)pMVar7[2].h;
  }
  else {
    local_190 = 1;
    uVar15 = (long)pMVar7[2].w / 4 & 0xffffffff;
  }
  piVar14 = &this->num_class;
  if (iVar6 == -0xe9) {
    piVar14 = &pMVar7[1].h;
  }
  __new_size = (size_type)*piVar14;
  local_98.cstep = 0;
  local_98.data = (float *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  Mat::create(&local_98,4,(int)uVar15,4,opt->workspace_allocator);
  iVar17 = -100;
  if (((float *)local_98.data != (float *)0x0) && ((long)local_98.c * local_98.cstep != 0)) {
    lVar27 = 0;
    pvVar8 = pMVar7[2].data;
    if (iVar6 == -0xe9) {
      local_160 = (void *)0x0;
    }
    else {
      local_160 = (void *)((long)pMVar7[2].w * pMVar7[2].elemsize + (long)pvVar8);
    }
    lVar21 = (long)local_98.w;
    lVar26 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
    pvVar9 = pMVar7->data;
    if ((int)uVar15 < 1) {
      uVar15 = 0;
    }
    sVar18 = 1;
    sVar24 = __new_size;
    if (iVar6 == -0xe9) {
      sVar24 = sVar18;
    }
    lVar19 = 0;
    pfVar22 = (float *)local_98.data;
    for (; uVar15 * 0x10 != lVar27; lVar27 = lVar27 + 0x10) {
      if (*(float *)((long)pMVar7[1].data + lVar19) < 1.0 - this->confidence_threshold) {
        pfVar12 = (float *)((long)local_160 + lVar27);
        if (local_160 == (void *)0x0) {
          pfVar12 = this->variances;
        }
        uVar3 = *(undefined8 *)pfVar12;
        uVar4 = *(undefined8 *)((long)pvVar9 + lVar27);
        uVar5 = *(undefined8 *)((long)pvVar9 + lVar27 + 8);
        fVar30 = (float)((ulong)uVar5 >> 0x20) *
                 (float)((ulong)*(undefined8 *)(pfVar12 + 2) >> 0x20);
        local_48 = CONCAT44(fVar30,(float)uVar5 * (float)*(undefined8 *)(pfVar12 + 2));
        uStack_40 = 0;
        fVar30 = expf(fVar30);
        fVar28 = expf((float)local_48);
        pfVar12 = (float *)((long)pvVar8 + lVar27);
        fVar32 = pfVar12[2] - *pfVar12;
        fVar33 = pfVar12[3] - pfVar12[1];
        fVar29 = (*pfVar12 + pfVar12[2]) * 0.5 + fVar32 * (float)uVar4 * (float)uVar3;
        fVar31 = (pfVar12[1] + pfVar12[3]) * 0.5 +
                 fVar33 * (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar3 >> 0x20);
        fVar28 = fVar28 * fVar32 * 0.5;
        fVar30 = fVar30 * fVar33 * 0.5;
        *pfVar22 = fVar29 - fVar28;
        pfVar22[1] = fVar31 - fVar30;
        pfVar22[2] = fVar29 + fVar28;
        pfVar22[3] = fVar31 + fVar30;
      }
      lVar19 = lVar19 + sVar24 * 4;
      pfVar22 = (float *)((long)pfVar22 + lVar21 * lVar26);
    }
    all_class_bbox_rects.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_class_bbox_rects.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_class_bbox_rects.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    all_class_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_class_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_class_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&all_class_bbox_rects,__new_size);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&all_class_bbox_scores,__new_size);
    sVar24 = __new_size;
    if (iVar6 == -0xe9) {
      sVar24 = sVar18;
    }
    lVar27 = local_190 * 4;
    while( true ) {
      if ((long)__new_size <= (long)sVar18) break;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar26 = lVar27;
      for (uVar20 = 0; uVar15 != uVar20; uVar20 = uVar20 + 1) {
        fVar30 = *(float *)((long)pMVar7[1].data + lVar26);
        picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(picked.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,fVar30);
        if (this->confidence_threshold <= fVar30 && fVar30 != this->confidence_threshold) {
          lVar21 = (long)local_98.w * uVar20 *
                   CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
          bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(*(undefined4 *)((long)local_98.data + lVar21 + 4),
                                 *(float *)((long)local_98.data + lVar21));
          bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(*(undefined4 *)((long)local_98.data + lVar21 + 0xc),
                                 *(undefined4 *)((long)local_98.data + lVar21 + 8));
          bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(bbox_rects.
                                 super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 (int)sVar18);
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores,
                     (value_type *)&bbox_rects);
          std::vector<float,_std::allocator<float>_>::push_back
                    (&class_bbox_scores,(value_type_conflict *)&picked);
        }
        lVar26 = lVar26 + sVar24 * 4;
      }
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores,
                 &class_bbox_scores);
      if (this->nms_top_k <
          (int)(((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x14)) {
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores,
                   (long)this->nms_top_k);
        std::vector<float,_std::allocator<float>_>::resize(&class_bbox_scores,(long)this->nms_top_k)
        ;
      }
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fVar30 = this->nms_threshold;
      __n = ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x14;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&bbox_rects,__n,
                 (allocator_type *)&local_150);
      pfVar13 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + 2;
      for (sVar16 = 0; __n != sVar16; sVar16 = sVar16 + 1) {
        (&(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_start)->xmin)[sVar16] =
             ((float)((ulong)*(undefined8 *)pfVar13 >> 0x20) -
             (float)((ulong)*(undefined8 *)(pfVar13 + -2) >> 0x20)) *
             ((float)*(undefined8 *)pfVar13 - (float)*(undefined8 *)(pfVar13 + -2));
        pfVar13 = pfVar13 + 5;
      }
      for (local_150 = 0; local_150 < __n; local_150 = local_150 + 1) {
        pfVar22 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + local_150 * 5;
        uVar23 = (ulong)((long)picked.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)picked.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3;
        uVar20 = uVar23 & 0xffffffff;
        if ((int)uVar23 < 1) {
          uVar20 = 0;
        }
        uVar23 = 1;
        for (uVar25 = 0; uVar20 != uVar25; uVar25 = uVar25 + 1) {
          uVar10 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar25];
          fVar28 = *pfVar22;
          fVar29 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10 * 5 + 2];
          fVar31 = 0.0;
          if (fVar28 <= fVar29) {
            pfVar12 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar10 * 5;
            fVar32 = pfVar22[2];
            fVar33 = *pfVar12;
            if (fVar33 <= fVar32) {
              fVar1 = pfVar22[1];
              fVar34 = pfVar12[3];
              if (fVar1 <= fVar34) {
                fVar2 = pfVar22[3];
                fVar35 = pfVar12[1];
                if (fVar35 <= fVar2) {
                  if (fVar32 <= fVar29) {
                    fVar29 = fVar32;
                  }
                  if (fVar33 <= fVar28) {
                    fVar33 = fVar28;
                  }
                  if (fVar2 <= fVar34) {
                    fVar34 = fVar2;
                  }
                  if (fVar35 <= fVar1) {
                    fVar35 = fVar1;
                  }
                  fVar31 = (fVar34 - fVar35) * (fVar29 - fVar33);
                }
              }
            }
          }
          if (fVar30 < fVar31 / (((&(bbox_rects.
                                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->xmin)[local_150] -
                                 fVar31) +
                                (&(bbox_rects.
                                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->xmin)[uVar10])) {
            uVar23 = 0;
          }
        }
        if ((int)uVar23 != 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&picked,(value_type_conflict5 *)&local_150);
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&bbox_rects);
      for (uVar20 = 0;
          uVar20 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar20 = uVar20 + 1
          ) {
        uVar10 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20];
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  (all_class_bbox_rects.
                   super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar18,
                   (value_type *)
                   (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar10 * 5));
        std::vector<float,_std::allocator<float>_>::push_back
                  (all_class_bbox_scores.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar18,
                   class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar10);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&class_bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                ((_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&bbox_scores);
      sVar18 = sVar18 + 1;
      lVar27 = lVar27 + local_190 * 4;
    }
    bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lVar26 = 0x20;
    for (lVar27 = 1;
        pvVar11 = all_class_bbox_scores.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar27 < (long)__new_size;
        lVar27 = lVar27 + 1) {
      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
      insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&bbox_rects,
                 (const_iterator)
                 bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)all_class_bbox_rects.
                         super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar26 + -8),
                 *(BBoxRect **)
                  ((long)&((all_class_bbox_rects.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar26));
      std::vector<float,std::allocator<float>>::
      insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                ((vector<float,std::allocator<float>> *)&bbox_scores,
                 (const_iterator)
                 bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)((long)pvVar11 + lVar26 + -8),
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)
                  ((long)&(pvVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar26));
      lVar26 = lVar26 + 0x18;
    }
    qsort_descent_inplace<ncnn::BBoxRect>(&bbox_rects,&bbox_scores);
    _h = (uint)(((long)bbox_rects.
                       super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x14);
    if (this->keep_top_k < (int)_h) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                (&bbox_rects,(long)this->keep_top_k);
      std::vector<float,_std::allocator<float>_>::resize(&bbox_scores,(long)this->keep_top_k);
      _h = (uint)(((long)bbox_rects.
                         super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)bbox_rects.
                        super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x14);
    }
    if (_h == 0) {
      iVar17 = 0;
    }
    else {
      this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_00,6,_h,4,opt->blob_allocator);
      pvVar8 = this_00->data;
      iVar17 = -100;
      if ((pvVar8 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
        iVar17 = 0;
        uVar15 = (ulong)_h;
        if ((int)_h < 1) {
          uVar15 = 0;
        }
        piVar14 = &(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start)->label;
        for (uVar20 = 0; uVar15 != uVar20; uVar20 = uVar20 + 1) {
          lVar27 = (long)this_00->w * uVar20 * this_00->elemsize;
          fVar30 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar20];
          *(float *)((long)pvVar8 + lVar27) = (float)*piVar14;
          *(float *)((long)pvVar8 + lVar27 + 4) = fVar30;
          *(float *)((long)pvVar8 + lVar27 + 8) = ((BBoxRect *)(piVar14 + -4))->xmin;
          *(int *)((long)pvVar8 + lVar27 + 0xc) = piVar14[-3];
          *(int *)((long)pvVar8 + lVar27 + 0x10) = piVar14[-2];
          *(int *)((long)pvVar8 + lVar27 + 0x14) = piVar14[-1];
          piVar14 = piVar14 + 5;
        }
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
              (&bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&all_class_bbox_scores);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&all_class_bbox_rects);
  }
  piVar14 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        free(local_98.data);
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        // if score of background class is larger than confidence threshold
        float score = mxnet_ssd_style ? confidence[i] : confidence[static_cast<size_t>(i) * static_cast<size_t>(num_class_copy)];
        if (score >= (1.0 - confidence_threshold))
        {
            continue;
        }
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = expf(var[2] * loc[2]) * pb_w;
        float bbox_h = expf(var[3] * loc[3]) * pb_h;

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector<std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector<std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = {bbox[0], bbox[1], bbox[2], bbox[3], i};
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<size_t> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (size_t j = 0; j < picked.size(); j++)
        {
            size_t z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label);
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}